

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderRead(xmlTextReaderPtr reader)

{
  _xmlNode *p_Var1;
  xmlParserCtxtPtr pxVar2;
  xmlChar *pxVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  xmlElementType xVar7;
  int iVar8;
  xmlParserErrors code;
  xmlNodePtr pxVar9;
  xmlXIncludeCtxtPtr ctxt;
  xmlNodePtr pxVar10;
  _xmlNode *p_Var11;
  xmlTextReaderState xVar12;
  xmlNodePtr pxVar13;
  int i;
  long lVar14;
  xmlNodePtr tmp;
  xmlNodePtr local_38;
  
  if ((reader != (xmlTextReaderPtr)0x0) && (xVar12 = reader->state, xVar12 != XML_TEXTREADER_ERROR))
  {
    reader->curnode = (xmlNodePtr)0x0;
    if (reader->doc != (xmlDocPtr)0x0) {
      if (xVar12 == XML_TEXTREADER_END) {
        return 0;
      }
      p_Var11 = reader->node;
      do {
        if (p_Var11 == (_xmlNode *)0x0) {
          p_Var11 = reader->doc->children;
          if (p_Var11 == (_xmlNode *)0x0) goto LAB_0016f8fb;
          reader->node = p_Var11;
          xVar12 = XML_TEXTREADER_START;
        }
        else if ((xVar12 == XML_TEXTREADER_BACKTRACK) ||
                ((xVar7 = p_Var11->type, xVar7 < XML_XINCLUDE_END &&
                 ((0x84020U >> (xVar7 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)))) {
LAB_0016f847:
          p_Var1 = p_Var11->next;
          if (p_Var1 == (_xmlNode *)0x0) {
            p_Var1 = p_Var11->parent;
            xVar12 = XML_TEXTREADER_END;
            if (p_Var1 != (_xmlNode *)0x0) {
              if ((p_Var1->type | XML_CDATA_SECTION_NODE) == XML_HTML_DOCUMENT_NODE) {
LAB_0016f8fb:
                reader->state = XML_TEXTREADER_END;
                return 0;
              }
              reader->node = p_Var1;
              reader->depth = reader->depth + -1;
              xVar12 = XML_TEXTREADER_BACKTRACK;
              p_Var11 = p_Var1;
            }
          }
          else {
            reader->node = p_Var1;
            xVar12 = XML_TEXTREADER_START;
            p_Var11 = p_Var1;
          }
        }
        else {
          p_Var1 = p_Var11->children;
          if (p_Var1 == (_xmlNode *)0x0) {
            if (xVar7 != XML_ATTRIBUTE_NODE) goto LAB_0016f847;
            xVar12 = XML_TEXTREADER_BACKTRACK;
          }
          else {
            reader->node = p_Var1;
            reader->depth = reader->depth + 1;
            xVar12 = XML_TEXTREADER_START;
            p_Var11 = p_Var1;
          }
        }
        reader->state = xVar12;
        if (1 < p_Var11->type - XML_XINCLUDE_START) {
          return 1;
        }
      } while( true );
    }
    if (reader->ctxt != (xmlParserCtxtPtr)0x0) {
      if (reader->mode != 0) {
        iVar8 = reader->ctxt->nodeNr;
        pxVar9 = reader->node;
        local_38 = pxVar9;
        goto LAB_0016f9ae;
      }
      reader->mode = 1;
      do {
        iVar8 = xmlTextReaderPushData(reader);
        if (iVar8 < 0) goto LAB_0016f95e;
        pxVar2 = reader->ctxt;
        if (pxVar2->node != (xmlNodePtr)0x0) {
          if (pxVar2->myDoc == (xmlDocPtr)0x0) {
            p_Var11 = reader->node;
          }
          else {
            p_Var11 = pxVar2->myDoc->children;
            reader->node = p_Var11;
          }
          if (p_Var11 == (_xmlNode *)0x0) {
            reader->node = *pxVar2->nodeTab;
          }
          goto LAB_0016f984;
        }
      } while ((reader->mode != 3) && (reader->state != XML_TEXTREADER_DONE));
      if (pxVar2->myDoc == (xmlDocPtr)0x0) {
        p_Var11 = reader->node;
      }
      else {
        p_Var11 = pxVar2->myDoc->children;
        reader->node = p_Var11;
      }
      if (p_Var11 != (_xmlNode *)0x0) {
LAB_0016f984:
        reader->state = XML_TEXTREADER_ELEMENT;
        reader->depth = 0;
        pxVar2->parseMode = XML_PARSE_READER;
        local_38 = (xmlNodePtr)0x0;
        xVar12 = XML_TEXTREADER_START;
        iVar8 = 0;
LAB_0016fc4a:
        do {
          pxVar9 = reader->node;
          if ((((pxVar9 != (xmlNodePtr)0x0) && (pxVar9->next == (_xmlNode *)0x0)) &&
              (pxVar9->type - XML_TEXT_NODE < 2)) &&
             (pxVar9 = xmlTextReaderExpand(reader), pxVar9 == (xmlNodePtr)0x0)) {
            return -1;
          }
          if (((reader->xinclude != 0) && (reader->in_xinclude == 0)) &&
             (reader->state != XML_TEXTREADER_BACKTRACK)) {
            pxVar9 = reader->node;
            if (pxVar9 == (xmlNodePtr)0x0) {
LAB_00170130:
              if (((reader->patternNr < 1) || (reader->state == XML_TEXTREADER_END)) ||
                 (reader->state == XML_TEXTREADER_BACKTRACK)) goto LAB_00170179;
              lVar14 = 0;
              goto LAB_00170149;
            }
            if (((pxVar9->type == XML_ELEMENT_NODE) && (pxVar9->ns != (xmlNs *)0x0)) &&
               ((iVar5 = xmlStrEqual(pxVar9->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
                iVar5 != 0 ||
                (iVar5 = xmlStrEqual(reader->node->ns->href,
                                     (xmlChar *)"http://www.w3.org/2001/XInclude"), iVar5 != 0)))) {
              if (reader->xincctxt == (xmlXIncludeCtxtPtr)0x0) {
                ctxt = xmlXIncludeNewContext(reader->ctxt->myDoc);
                reader->xincctxt = ctxt;
                if (ctxt == (xmlXIncludeCtxtPtr)0x0) {
                  xmlTextReaderErrMemory(reader);
                  return -1;
                }
                xmlXIncludeSetFlags(ctxt,reader->parserFlags & 0xffff7fff);
                xmlXIncludeSetStreamingMode(reader->xincctxt,1);
                if ((reader->errorFunc != (xmlTextReaderErrorFunc)0x0) ||
                   (reader->sErrorFunc != (xmlStructuredErrorFunc)0x0)) {
                  xmlXIncludeSetErrorHandler(reader->xincctxt,xmlTextReaderStructuredRelay,reader);
                }
                if (reader->resourceLoader != (xmlResourceLoader)0x0) {
                  xmlXIncludeSetResourceLoader
                            (reader->xincctxt,reader->resourceLoader,reader->resourceCtxt);
                }
              }
              pxVar9 = xmlTextReaderExpand(reader);
              if (pxVar9 == (xmlNodePtr)0x0) {
                return -1;
              }
              iVar5 = xmlXIncludeProcessNode(reader->xincctxt,reader->node);
              if (-1 < iVar5) goto LAB_0016fdb1;
              code = xmlXIncludeGetLastError(reader->xincctxt);
              iVar8 = xmlIsCatastrophicError(3,code);
              if (iVar8 == 0) {
                return -1;
              }
              xmlFatalErr(reader->ctxt,code,(char *)0x0);
              goto LAB_0016ffe7;
            }
          }
LAB_0016fdb1:
          pxVar9 = reader->node;
          if (pxVar9 == (xmlNodePtr)0x0) goto LAB_00170130;
          xVar7 = pxVar9->type;
          if (xVar7 == XML_ENTITY_REF_NODE) {
            if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
LAB_001700a6:
              if (((pxVar9->type != XML_ENTITY_DECL) || (reader->ent == (xmlNodePtr)0x0)) ||
                 (reader->ent->children != pxVar9)) {
                if (reader->validate != XML_TEXTREADER_NOT_VALIDATE) {
                  if (pxVar9->type == XML_ELEMENT_NODE) {
                    if (((reader->state != XML_TEXTREADER_END) &&
                        (reader->state != XML_TEXTREADER_BACKTRACK)) &&
                       (iVar8 = xmlTextReaderValidatePush(reader), iVar8 < 0)) {
                      return -1;
                    }
                  }
                  else if (pxVar9->type - XML_TEXT_NODE < 2) {
                    pxVar3 = pxVar9->content;
                    iVar8 = xmlStrlen(pxVar3);
                    xmlTextReaderValidateCData(reader,pxVar3,iVar8);
                  }
                }
                goto LAB_00170130;
              }
              pxVar9 = xmlTextReaderEntPop(reader);
              reader->node = pxVar9;
              reader->depth = reader->depth + 1;
            }
            else {
              if (reader->ctxt->replaceEntities != 1) {
                if ((reader->ctxt != (xmlParserCtxtPtr)0x0) &&
                   (pxVar13 = pxVar9, reader->validate != XML_TEXTREADER_NOT_VALIDATE)) {
LAB_0016fe68:
                  xVar7 = pxVar13->type;
                  if (xVar7 - XML_TEXT_NODE < 2) {
                    pxVar3 = pxVar13->content;
                    iVar5 = xmlStrlen(pxVar3);
                    xmlTextReaderValidateCData(reader,pxVar3,iVar5);
LAB_0016feec:
                    pxVar10 = pxVar13->children;
                    if (pxVar10 == (xmlNodePtr)0x0) {
                      if ((pxVar13->type == XML_ELEMENT_NODE) &&
                         (iVar5 = xmlTextReaderValidatePop(reader), iVar5 < 0)) {
                        return -1;
                      }
LAB_0016ff32:
                      do {
                        pxVar10 = pxVar13->next;
                        if (pxVar10 != (xmlNodePtr)0x0) break;
                        pxVar10 = pxVar13->parent;
                        xVar7 = pxVar10->type;
                        if (xVar7 == XML_ELEMENT_NODE) {
                          if (reader->entNr == 0) {
                            while ((pxVar13 = pxVar10->last, pxVar13 != (xmlNodePtr)0x0 &&
                                   ((pxVar13->extra & 2) == 0))) {
                              xmlUnlinkNode(pxVar13);
                              xmlTextReaderFreeNode(reader,pxVar13);
                            }
                          }
                          reader->node = pxVar10;
                          iVar5 = xmlTextReaderValidatePop(reader);
                          if (iVar5 < 0) {
                            return -1;
                          }
                          xVar7 = pxVar10->type;
                        }
                        if (((xVar7 == XML_ENTITY_DECL) && (reader->ent != (xmlNodePtr)0x0)) &&
                           (reader->ent->children == pxVar10)) {
                          pxVar10 = xmlTextReaderEntPop(reader);
                        }
                        pxVar13 = pxVar10;
                      } while (pxVar10 != pxVar9);
                    }
LAB_0016fef6:
                    if ((pxVar10 == (xmlNodePtr)0x0) || (pxVar13 = pxVar10, pxVar10 == pxVar9))
                    goto LAB_001700a2;
                    goto LAB_0016fe68;
                  }
                  if (xVar7 == XML_ELEMENT_NODE) {
                    reader->node = pxVar13;
                    iVar5 = xmlTextReaderValidatePush(reader);
                    if (iVar5 < 0) {
                      return -1;
                    }
                    goto LAB_0016feec;
                  }
                  if (xVar7 != XML_ENTITY_REF_NODE) goto LAB_0016feec;
                  p_Var11 = pxVar13->children;
                  if ((((p_Var11 != (_xmlNode *)0x0) && (p_Var11->type == XML_ENTITY_DECL)) &&
                      (p_Var11->children != (_xmlNode *)0x0)) &&
                     (iVar5 = xmlTextReaderEntPush(reader,pxVar13), -1 < iVar5)) {
                    pxVar10 = pxVar13->children->children;
                    goto LAB_0016fef6;
                  }
                  if (pxVar13 != pxVar9) goto LAB_0016ff32;
LAB_001700a2:
                  reader->node = pxVar9;
                }
                goto LAB_001700a6;
              }
              p_Var11 = pxVar9->children;
              if (((p_Var11 == (_xmlNode *)0x0) || (p_Var11->type != XML_ENTITY_DECL)) ||
                 (p_Var11->children == (_xmlNode *)0x0)) goto LAB_001700a6;
              iVar5 = xmlTextReaderEntPush(reader,pxVar9);
              pxVar9 = reader->node;
              if (-1 < iVar5) {
                pxVar9 = pxVar9->children->children;
                reader->node = pxVar9;
                if (pxVar9 == (xmlNodePtr)0x0) goto LAB_00170130;
                goto LAB_001700a6;
              }
            }
LAB_0016f9ae:
            if (pxVar9 == (xmlNodePtr)0x0) {
              if (reader->mode == 3) {
                return 0;
              }
              goto LAB_0016ffe7;
            }
          }
          else {
            iVar5 = 1;
            if (xVar7 != XML_XINCLUDE_START) {
              if (xVar7 != XML_XINCLUDE_END) goto LAB_001700a6;
              iVar5 = -1;
            }
            reader->in_xinclude = reader->in_xinclude + iVar5;
          }
          while (pxVar9->next == (_xmlNode *)0x0) {
            pxVar2 = reader->ctxt;
            if (pxVar2->nodeNr != iVar8) {
LAB_0016fa64:
              if (xVar12 != XML_TEXTREADER_BACKTRACK) goto LAB_0016fa78;
              goto LAB_0016fbb1;
            }
            if (((xVar12 != XML_TEXTREADER_BACKTRACK) &&
                (p_Var11 = pxVar9->children, p_Var11 != (_xmlNode *)0x0)) &&
               (((xVar7 = pxVar9->type, xVar7 != XML_ENTITY_REF_NODE &&
                 ((p_Var11->type != XML_TEXT_NODE || (p_Var11->next != (_xmlNode *)0x0)))) &&
                ((XML_DTD_NODE < xVar7 ||
                 ((0x6200U >> (xVar7 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0))))))
            goto LAB_0016fa83;
            pxVar13 = pxVar2->node;
            if ((((pxVar13 != (xmlNodePtr)0x0) && (pxVar13 != pxVar9)) &&
                (pxVar13 != pxVar9->parent)) ||
               ((pxVar2->instate == XML_PARSER_EOF || (1 < pxVar2->disableSAX)))) goto LAB_0016fa64;
            iVar5 = xmlTextReaderPushData(reader);
            if (iVar5 < 0) goto LAB_0016ffe7;
            pxVar9 = reader->node;
            if (pxVar9 == (xmlNodePtr)0x0) goto LAB_0016fa56;
          }
          if (xVar12 != XML_TEXTREADER_BACKTRACK) {
LAB_0016fa78:
            p_Var11 = pxVar9->children;
            bVar4 = false;
            if (p_Var11 != (_xmlNode *)0x0) {
LAB_0016fa83:
              if ((XML_XINCLUDE_START < pxVar9->type) ||
                 (bVar4 = true,
                 (0x84020U >> (pxVar9->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) {
                reader->node = p_Var11;
                reader->depth = reader->depth + 1;
                reader->state = XML_TEXTREADER_ELEMENT;
                goto LAB_0016fc4a;
              }
            }
            if (pxVar9->next == (_xmlNode *)0x0) {
              if (((xVar12 == XML_TEXTREADER_ELEMENT) &&
                  (pxVar9->type == XML_ELEMENT_NODE && !bVar4)) && ((pxVar9->extra & 1) == 0))
              goto LAB_0016fba2;
LAB_0016fbb1:
              if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) &&
                 (pxVar9->type == XML_ELEMENT_NODE)) {
                iVar5 = xmlTextReaderValidatePop(reader);
                if (iVar5 < 0) {
                  return -1;
                }
                pxVar9 = reader->node;
              }
              iVar5 = reader->preserves;
              iVar6 = iVar5;
              if ((0 < iVar5) && (iVar6 = 1, (pxVar9->extra & 4) != 0)) {
                iVar6 = iVar5 + -1;
                reader->preserves = iVar6;
              }
              p_Var11 = pxVar9->parent;
              reader->node = p_Var11;
              if ((p_Var11 == (_xmlNode *)0x0) ||
                 ((p_Var11->type | XML_CDATA_SECTION_NODE) == XML_HTML_DOCUMENT_NODE)) {
                if (reader->mode != 3) {
                  iVar8 = xmlParseChunk(reader->ctxt,"",0,1);
                  reader->state = XML_TEXTREADER_DONE;
                  if (iVar8 != 0) {
LAB_0016ffe7:
                    reader->mode = 2;
                    reader->state = XML_TEXTREADER_ERROR;
                    return -1;
                  }
                }
                reader->node = (xmlNodePtr)0x0;
                reader->depth = -1;
                if ((((local_38 != (xmlNodePtr)0x0) && (reader->preserves == 0)) &&
                    (reader->in_xinclude == 0)) &&
                   (((reader->entNr == 0 && (local_38->type != XML_DTD_NODE)) &&
                    ((local_38->extra & 2) == 0)))) {
                  xmlUnlinkNode(local_38);
                  xmlTextReaderFreeNode(reader,local_38);
                }
LAB_0016fa56:
                reader->state = XML_TEXTREADER_DONE;
                return 0;
              }
              if (((iVar6 == 0) && (reader->in_xinclude == 0)) &&
                 ((reader->entNr == 0 &&
                  ((pxVar9 = p_Var11->last, pxVar9 != (xmlNodePtr)0x0 && ((pxVar9->extra & 2) == 0))
                  )))) {
                xmlUnlinkNode(pxVar9);
                xmlTextReaderFreeNode(reader,pxVar9);
              }
              reader->depth = reader->depth + -1;
              reader->state = XML_TEXTREADER_BACKTRACK;
            }
            else {
              if ((((xVar12 != XML_TEXTREADER_ELEMENT) ||
                   (pxVar9->type != XML_ELEMENT_NODE || bVar4)) || ((pxVar9->extra & 1) != 0)) ||
                 (0 < reader->in_xinclude)) goto LAB_0016face;
LAB_0016fba2:
              reader->state = XML_TEXTREADER_END;
              xVar12 = XML_TEXTREADER_ELEMENT;
            }
            goto LAB_0016fc4a;
          }
LAB_0016face:
          if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) &&
             (pxVar9->type == XML_ELEMENT_NODE)) {
            iVar5 = xmlTextReaderValidatePop(reader);
            if (iVar5 < 0) {
              return -1;
            }
            pxVar9 = reader->node;
          }
          iVar5 = reader->preserves;
          iVar6 = iVar5;
          if ((0 < iVar5) && (iVar6 = 1, (pxVar9->extra & 4) != 0)) {
            iVar6 = iVar5 + -1;
            reader->preserves = iVar6;
          }
          p_Var11 = pxVar9->next;
          reader->node = p_Var11;
          reader->state = XML_TEXTREADER_ELEMENT;
          if ((((iVar6 == 0) && (reader->in_xinclude == 0)) && (reader->entNr == 0)) &&
             (((pxVar9 = p_Var11->prev, pxVar9 != (xmlNodePtr)0x0 && (pxVar9->type != XML_DTD_NODE))
              && ((pxVar9->extra & 2) == 0)))) {
            if (local_38 == pxVar9) {
              local_38 = (xmlNodePtr)0x0;
            }
            xmlUnlinkNode(pxVar9);
            xmlTextReaderFreeNode(reader,pxVar9);
          }
        } while( true );
      }
LAB_0016f95e:
      reader->mode = 2;
      reader->state = XML_TEXTREADER_ERROR;
    }
  }
  return -1;
  while( true ) {
    iVar8 = xmlPatternMatch(reader->patternTab[lVar14],reader->node);
    lVar14 = lVar14 + 1;
    if (iVar8 == 1) break;
LAB_00170149:
    if (reader->patternNr <= lVar14) goto LAB_00170179;
  }
  xmlTextReaderPreserve(reader);
LAB_00170179:
  if (((reader->validate == XML_TEXTREADER_VALIDATE_XSD) && (reader->xsdValidErrors == 0)) &&
     (reader->xsdValidCtxt != (xmlSchemaValidCtxtPtr)0x0)) {
    iVar8 = xmlSchemaIsValid(reader->xsdValidCtxt);
    reader->xsdValidErrors = (uint)(iVar8 == 0);
  }
  return 1;
}

Assistant:

int
xmlTextReaderRead(xmlTextReaderPtr reader) {
    int val, olddepth = 0;
    xmlTextReaderState oldstate = XML_TEXTREADER_START;
    xmlNodePtr oldnode = NULL;

    if (reader == NULL)
	return(-1);
    if (reader->state == XML_TEXTREADER_ERROR)
        return(-1);

    reader->curnode = NULL;
    if (reader->doc != NULL)
        return(xmlTextReaderReadTree(reader));
    if (reader->ctxt == NULL)
	return(-1);

    if (reader->mode == XML_TEXTREADER_MODE_INITIAL) {
	reader->mode = XML_TEXTREADER_MODE_INTERACTIVE;
	/*
	 * Initial state
	 */
	do {
	    val = xmlTextReaderPushData(reader);
            if (val < 0) {
                reader->mode = XML_TEXTREADER_MODE_ERROR;
                reader->state = XML_TEXTREADER_ERROR;
                return(-1);
            }
	} while ((reader->ctxt->node == NULL) &&
		 ((reader->mode != XML_TEXTREADER_MODE_EOF) &&
		  (reader->state != XML_TEXTREADER_DONE)));
	if (reader->ctxt->node == NULL) {
	    if (reader->ctxt->myDoc != NULL) {
		reader->node = reader->ctxt->myDoc->children;
	    }
	    if (reader->node == NULL) {
                reader->mode = XML_TEXTREADER_MODE_ERROR;
                reader->state = XML_TEXTREADER_ERROR;
		return(-1);
	    }
	    reader->state = XML_TEXTREADER_ELEMENT;
	} else {
	    if (reader->ctxt->myDoc != NULL) {
		reader->node = reader->ctxt->myDoc->children;
	    }
	    if (reader->node == NULL)
		reader->node = reader->ctxt->nodeTab[0];
	    reader->state = XML_TEXTREADER_ELEMENT;
	}
	reader->depth = 0;
	reader->ctxt->parseMode = XML_PARSE_READER;
	goto node_found;
    }
    oldstate = reader->state;
    olddepth = reader->ctxt->nodeNr;
    oldnode = reader->node;

get_next_node:
    if (reader->node == NULL) {
	if (reader->mode == XML_TEXTREADER_MODE_EOF) {
	    return(0);
        } else {
            reader->mode = XML_TEXTREADER_MODE_ERROR;
            reader->state = XML_TEXTREADER_ERROR;
	    return(-1);
        }
    }

    /*
     * If we are not backtracking on ancestors or examined nodes,
     * that the parser didn't finished or that we aren't at the end
     * of stream, continue processing.
     */
    while ((reader->node != NULL) && (reader->node->next == NULL) &&
	   (reader->ctxt->nodeNr == olddepth) &&
           ((oldstate == XML_TEXTREADER_BACKTRACK) ||
            (reader->node->children == NULL) ||
	    (reader->node->type == XML_ENTITY_REF_NODE) ||
	    ((reader->node->children != NULL) &&
	     (reader->node->children->type == XML_TEXT_NODE) &&
	     (reader->node->children->next == NULL)) ||
	    (reader->node->type == XML_DTD_NODE) ||
	    (reader->node->type == XML_DOCUMENT_NODE) ||
	    (reader->node->type == XML_HTML_DOCUMENT_NODE)) &&
	   ((reader->ctxt->node == NULL) ||
	    (reader->ctxt->node == reader->node) ||
	    (reader->ctxt->node == reader->node->parent)) &&
	   (reader->ctxt->instate != XML_PARSER_EOF) &&
	   (PARSER_STOPPED(reader->ctxt) == 0)) {
	val = xmlTextReaderPushData(reader);
	if (val < 0) {
            reader->mode = XML_TEXTREADER_MODE_ERROR;
            reader->state = XML_TEXTREADER_ERROR;
	    return(-1);
        }
	if (reader->node == NULL)
	    goto node_end;
    }
    if (oldstate != XML_TEXTREADER_BACKTRACK) {
	if ((reader->node->children != NULL) &&
	    (reader->node->type != XML_ENTITY_REF_NODE) &&
	    (reader->node->type != XML_XINCLUDE_START) &&
	    (reader->node->type != XML_DTD_NODE)) {
	    reader->node = reader->node->children;
	    reader->depth++;
	    reader->state = XML_TEXTREADER_ELEMENT;
	    goto node_found;
	}
    }
    if (reader->node->next != NULL) {
	if ((oldstate == XML_TEXTREADER_ELEMENT) &&
            (reader->node->type == XML_ELEMENT_NODE) &&
	    (reader->node->children == NULL) &&
	    ((reader->node->extra & NODE_IS_EMPTY) == 0)
#ifdef LIBXML_XINCLUDE_ENABLED
	    && (reader->in_xinclude <= 0)
#endif
	    ) {
	    reader->state = XML_TEXTREADER_END;
	    goto node_found;
	}
#ifdef LIBXML_REGEXP_ENABLED
	if ((reader->validate) &&
	    (reader->node->type == XML_ELEMENT_NODE))
	    if (xmlTextReaderValidatePop(reader) < 0)
                return(-1);
#endif /* LIBXML_REGEXP_ENABLED */
        if ((reader->preserves > 0) &&
	    (reader->node->extra & NODE_IS_SPRESERVED))
	    reader->preserves--;
	reader->node = reader->node->next;
	reader->state = XML_TEXTREADER_ELEMENT;

	/*
	 * Cleanup of the old node
	 */
	if ((reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
	    (reader->in_xinclude == 0) &&
#endif
	    (reader->entNr == 0) &&
	    (reader->node->prev != NULL) &&
            (reader->node->prev->type != XML_DTD_NODE)) {
	    xmlNodePtr tmp = reader->node->prev;
	    if ((tmp->extra & NODE_IS_PRESERVED) == 0) {
                if (oldnode == tmp)
                    oldnode = NULL;
		xmlUnlinkNode(tmp);
		xmlTextReaderFreeNode(reader, tmp);
	    }
	}

	goto node_found;
    }
    if ((oldstate == XML_TEXTREADER_ELEMENT) &&
	(reader->node->type == XML_ELEMENT_NODE) &&
	(reader->node->children == NULL) &&
	((reader->node->extra & NODE_IS_EMPTY) == 0)) {;
	reader->state = XML_TEXTREADER_END;
	goto node_found;
    }
#ifdef LIBXML_REGEXP_ENABLED
    if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) &&
        (reader->node->type == XML_ELEMENT_NODE)) {
        if (xmlTextReaderValidatePop(reader) < 0)
            return(-1);
    }
#endif /* LIBXML_REGEXP_ENABLED */
    if ((reader->preserves > 0) &&
	(reader->node->extra & NODE_IS_SPRESERVED))
	reader->preserves--;
    reader->node = reader->node->parent;
    if ((reader->node == NULL) ||
	(reader->node->type == XML_DOCUMENT_NODE) ||
	(reader->node->type == XML_HTML_DOCUMENT_NODE)) {
	if (reader->mode != XML_TEXTREADER_MODE_EOF) {
	    val = xmlParseChunk(reader->ctxt, "", 0, 1);
	    reader->state = XML_TEXTREADER_DONE;
	    if (val != 0) {
                reader->mode = XML_TEXTREADER_MODE_ERROR;
                reader->state = XML_TEXTREADER_ERROR;
	        return(-1);
            }
	}
	reader->node = NULL;
	reader->depth = -1;

	/*
	 * Cleanup of the old node
	 */
	if ((oldnode != NULL) && (reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
	    (reader->in_xinclude == 0) &&
#endif
	    (reader->entNr == 0) &&
	    (oldnode->type != XML_DTD_NODE) &&
	    ((oldnode->extra & NODE_IS_PRESERVED) == 0)) {
	    xmlUnlinkNode(oldnode);
	    xmlTextReaderFreeNode(reader, oldnode);
	}

	goto node_end;
    }
    if ((reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
        (reader->in_xinclude == 0) &&
#endif
	(reader->entNr == 0) &&
        (reader->node->last != NULL) &&
        ((reader->node->last->extra & NODE_IS_PRESERVED) == 0)) {
	xmlNodePtr tmp = reader->node->last;
	xmlUnlinkNode(tmp);
	xmlTextReaderFreeNode(reader, tmp);
    }
    reader->depth--;
    reader->state = XML_TEXTREADER_BACKTRACK;

node_found:
    /*
     * If we are in the middle of a piece of CDATA make sure it's finished
     */
    if ((reader->node != NULL) &&
        (reader->node->next == NULL) &&
        ((reader->node->type == XML_TEXT_NODE) ||
	 (reader->node->type == XML_CDATA_SECTION_NODE))) {
            if (xmlTextReaderExpand(reader) == NULL)
	        return -1;
    }

#ifdef LIBXML_XINCLUDE_ENABLED
    /*
     * Handle XInclude if asked for
     */
    if ((reader->xinclude) && (reader->in_xinclude == 0) &&
        (reader->state != XML_TEXTREADER_BACKTRACK) &&
        (reader->node != NULL) &&
	(reader->node->type == XML_ELEMENT_NODE) &&
	(reader->node->ns != NULL) &&
	((xmlStrEqual(reader->node->ns->href, XINCLUDE_NS)) ||
	 (xmlStrEqual(reader->node->ns->href, XINCLUDE_OLD_NS)))) {
	if (reader->xincctxt == NULL) {
	    reader->xincctxt = xmlXIncludeNewContext(reader->ctxt->myDoc);
            if (reader->xincctxt == NULL) {
                xmlTextReaderErrMemory(reader);
                return(-1);
            }
	    xmlXIncludeSetFlags(reader->xincctxt,
	                        reader->parserFlags & (~XML_PARSE_NOXINCNODE));
            xmlXIncludeSetStreamingMode(reader->xincctxt, 1);
            if ((reader->errorFunc != NULL) || (reader->sErrorFunc != NULL))
                xmlXIncludeSetErrorHandler(reader->xincctxt,
                        xmlTextReaderStructuredRelay, reader);
            if (reader->resourceLoader != NULL)
                xmlXIncludeSetResourceLoader(reader->xincctxt,
                        reader->resourceLoader, reader->resourceCtxt);
	}
	/*
	 * expand that node and process it
	 */
	if (xmlTextReaderExpand(reader) == NULL)
	    return(-1);
        if (xmlXIncludeProcessNode(reader->xincctxt, reader->node) < 0) {
            int err = xmlXIncludeGetLastError(reader->xincctxt);

            if (xmlIsCatastrophicError(XML_ERR_FATAL, err)) {
                xmlFatalErr(reader->ctxt, err, NULL);
                reader->mode = XML_TEXTREADER_MODE_ERROR;
                reader->state = XML_TEXTREADER_ERROR;
            }
            return(-1);
        }
    }
    if ((reader->node != NULL) && (reader->node->type == XML_XINCLUDE_START)) {
        reader->in_xinclude++;
	goto get_next_node;
    }
    if ((reader->node != NULL) && (reader->node->type == XML_XINCLUDE_END)) {
        reader->in_xinclude--;
	goto get_next_node;
    }
#endif
    /*
     * Handle entities enter and exit when in entity replacement mode
     */
    if ((reader->node != NULL) &&
	(reader->node->type == XML_ENTITY_REF_NODE) &&
	(reader->ctxt != NULL) && (reader->ctxt->replaceEntities == 1)) {
	if ((reader->node->children != NULL) &&
	    (reader->node->children->type == XML_ENTITY_DECL) &&
	    (reader->node->children->children != NULL)) {
	    if (xmlTextReaderEntPush(reader, reader->node) < 0)
                goto get_next_node;
	    reader->node = reader->node->children->children;
	}
#ifdef LIBXML_REGEXP_ENABLED
    } else if ((reader->node != NULL) &&
	       (reader->node->type == XML_ENTITY_REF_NODE) &&
	       (reader->ctxt != NULL) && (reader->validate)) {
	if (xmlTextReaderValidateEntity(reader) < 0)
            return(-1);
#endif /* LIBXML_REGEXP_ENABLED */
    }
    if ((reader->node != NULL) &&
	(reader->node->type == XML_ENTITY_DECL) &&
	(reader->ent != NULL) && (reader->ent->children == reader->node)) {
	reader->node = xmlTextReaderEntPop(reader);
	reader->depth++;
        goto get_next_node;
    }
#ifdef LIBXML_REGEXP_ENABLED
    if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) && (reader->node != NULL)) {
	xmlNodePtr node = reader->node;

	if ((node->type == XML_ELEMENT_NODE) &&
            ((reader->state != XML_TEXTREADER_END) &&
	     (reader->state != XML_TEXTREADER_BACKTRACK))) {
	    if (xmlTextReaderValidatePush(reader) < 0)
                return(-1);
	} else if ((node->type == XML_TEXT_NODE) ||
		   (node->type == XML_CDATA_SECTION_NODE)) {
            xmlTextReaderValidateCData(reader, node->content,
	                               xmlStrlen(node->content));
	}
    }
#endif /* LIBXML_REGEXP_ENABLED */
#ifdef LIBXML_PATTERN_ENABLED
    if ((reader->patternNr > 0) && (reader->state != XML_TEXTREADER_END) &&
        (reader->state != XML_TEXTREADER_BACKTRACK)) {
        int i;
	for (i = 0;i < reader->patternNr;i++) {
	     if (xmlPatternMatch(reader->patternTab[i], reader->node) == 1) {
	         xmlTextReaderPreserve(reader);
		 break;
             }
	}
    }
#endif /* LIBXML_PATTERN_ENABLED */
#ifdef LIBXML_SCHEMAS_ENABLED
    if ((reader->validate == XML_TEXTREADER_VALIDATE_XSD) &&
        (reader->xsdValidErrors == 0) &&
	(reader->xsdValidCtxt != NULL)) {
	reader->xsdValidErrors = !xmlSchemaIsValid(reader->xsdValidCtxt);
    }
#endif /* LIBXML_PATTERN_ENABLED */
    return(1);
node_end:
    reader->state = XML_TEXTREADER_DONE;
    return(0);
}